

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O2

void Abc_NtkSopTranspose(char *pSop,int nVars,Vec_Ptr_t *vCubes,Vec_Str_t *vStore)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  vCubes->nSize = 0;
  for (; *pSop != '\0'; pSop = pSop + (nVars + 3)) {
    Vec_PtrPush(vCubes,pSop);
  }
  vStore->nSize = 0;
  uVar3 = 0;
  uVar5 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar5 = uVar3;
  }
  for (; uVar3 != uVar5; uVar3 = uVar3 + 1) {
    for (iVar2 = 0; iVar2 < vCubes->nSize; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(vCubes,iVar2);
      Vec_StrPush(vStore,*(char *)((long)pvVar1 + uVar3));
    }
    Vec_StrPush(vStore,'\0');
  }
  iVar2 = vCubes->nSize;
  vCubes->nSize = 0;
  lVar4 = 0;
  while( true ) {
    bVar6 = uVar5 == 0;
    uVar5 = uVar5 - 1;
    if (bVar6) {
      return;
    }
    if ((lVar4 < 0) || (vStore->nSize <= lVar4)) break;
    Vec_PtrPush(vCubes,vStore->pArray + lVar4);
    lVar4 = lVar4 + (iVar2 + 1);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
}

Assistant:

void Abc_NtkSopTranspose( char * pSop, int nVars, Vec_Ptr_t * vCubes, Vec_Str_t * vStore )
{
    char * pCube; 
    int nCubes, v, c;
    // collect original cubes
    Vec_PtrClear( vCubes );
    Abc_SopForEachCube( pSop, nVars, pCube )
        Vec_PtrPush( vCubes, pCube );
    // rebuild the cubes
    Vec_StrClear( vStore );
    for ( v = 0; v < nVars; v++ )
    {
        Vec_PtrForEachEntry( char *, vCubes, pCube, c )
            Vec_StrPush( vStore, pCube[v] );
        Vec_StrPush( vStore, '\0' );
    }
    // get the cubes
    nCubes = Vec_PtrSize( vCubes );
    Vec_PtrClear( vCubes );
    for ( v = 0; v < nVars; v++ )
        Vec_PtrPush( vCubes, Vec_StrEntryP(vStore, v*(nCubes+1)) );
}